

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O2

void Cnf_ManTransferCuts(Cnf_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pObj;
  Cnf_Cut_t *pCVar1;
  int i;
  
  Aig_MmFlexRestart(p->pMemCuts);
  for (i = 0; p_00 = p->pManAig->vObjs, i < p_00->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      if ((*(ulong *)&pObj->field_0x18 & 0xffffffc0) == 0) {
        pCVar1 = (Cnf_Cut_t *)0x0;
      }
      else {
        pCVar1 = (Cnf_Cut_t *)0x0;
        if (0xfffffffd < ((uint)*(ulong *)&pObj->field_0x18 & 7) - 7) {
          pCVar1 = Cnf_CutCreate(p,pObj);
        }
      }
      (pObj->field_5).pData = pCVar1;
    }
  }
  return;
}

Assistant:

void Cnf_ManTransferCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_MmFlexRestart( p->pMemCuts );
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) && pObj->nRefs > 0 )
            pObj->pData = Cnf_CutCreate( p, pObj );
        else
            pObj->pData = NULL;
    }
}